

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersector1<4,_1,_true,_embree::avx2::ArrayIntersector1<embree::avx2::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  Geometry *pGVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  long lVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 (*pauVar32) [16];
  uint uVar33;
  long lVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  Scene *pSVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  undefined1 (*pauVar43) [16];
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  undefined4 uVar48;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar89;
  float fVar96;
  float fVar97;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  float fVar102;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar105 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar129 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_1544;
  ulong local_1540;
  ulong local_1538;
  RayHit *local_1530;
  RayQueryContext *local_1528;
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  long local_14c0;
  long local_14b8;
  RTCFilterFunctionNArguments local_14b0;
  undefined8 local_1480;
  float fStack_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1468;
  float fStack_1464;
  float local_1450;
  float local_144c;
  float local_1448;
  undefined4 local_1444;
  undefined4 local_1440;
  undefined4 local_143c;
  uint local_1438;
  uint local_1434;
  uint local_1430;
  undefined1 local_1420 [32];
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  float local_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  float local_1340;
  float fStack_133c;
  float fStack_1338;
  float fStack_1334;
  undefined1 local_1330 [16];
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined1 local_12e0 [16];
  undefined4 uStack_12d0;
  undefined4 uStack_12cc;
  undefined4 uStack_12c8;
  undefined4 uStack_12c4;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  float local_1160 [4];
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  undefined4 uStack_1144;
  undefined1 local_1140 [32];
  undefined1 local_1120 [8];
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  undefined4 uStack_1104;
  undefined1 local_1100 [32];
  undefined4 local_10e0;
  undefined4 uStack_10dc;
  undefined4 uStack_10d8;
  undefined4 uStack_10d4;
  undefined4 uStack_10d0;
  undefined4 uStack_10cc;
  undefined4 uStack_10c8;
  undefined4 uStack_10c4;
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  float fVar69;
  float fVar70;
  float fVar71;
  
  local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_fa0 != 8) {
    pauVar43 = (undefined1 (*) [16])local_f90;
    uStack_f98 = 0;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar55 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar61 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar81._8_4_ = 0x7fffffff;
    auVar81._0_8_ = 0x7fffffff7fffffff;
    auVar81._12_4_ = 0x7fffffff;
    auVar81 = vandps_avx((undefined1  [16])aVar2,auVar81);
    auVar90._8_4_ = 0x219392ef;
    auVar90._0_8_ = 0x219392ef219392ef;
    auVar90._12_4_ = 0x219392ef;
    auVar81 = vcmpps_avx(auVar81,auVar90,1);
    auVar91._8_4_ = 0x3f800000;
    auVar91._0_8_ = 0x3f8000003f800000;
    auVar91._12_4_ = 0x3f800000;
    auVar90 = vdivps_avx(auVar91,(undefined1  [16])aVar2);
    auVar92._8_4_ = 0x5d5e0b6b;
    auVar92._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar92._12_4_ = 0x5d5e0b6b;
    auVar81 = vblendvps_avx(auVar90,auVar92,auVar81);
    auVar82._0_4_ = auVar81._0_4_ * 0.99999964;
    auVar82._4_4_ = auVar81._4_4_ * 0.99999964;
    auVar82._8_4_ = auVar81._8_4_ * 0.99999964;
    auVar82._12_4_ = auVar81._12_4_ * 0.99999964;
    auVar72._0_4_ = auVar81._0_4_ * 1.0000004;
    auVar72._4_4_ = auVar81._4_4_ * 1.0000004;
    auVar72._8_4_ = auVar81._8_4_ * 1.0000004;
    auVar72._12_4_ = auVar81._12_4_ * 1.0000004;
    uVar48 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_1310._4_4_ = uVar48;
    local_1310._0_4_ = uVar48;
    local_1310._8_4_ = uVar48;
    local_1310._12_4_ = uVar48;
    auVar112 = ZEXT1664(local_1310);
    uVar48 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_1320._4_4_ = uVar48;
    local_1320._0_4_ = uVar48;
    local_1320._8_4_ = uVar48;
    local_1320._12_4_ = uVar48;
    auVar118 = ZEXT1664(local_1320);
    uVar48 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_1330._4_4_ = uVar48;
    local_1330._0_4_ = uVar48;
    local_1330._8_4_ = uVar48;
    local_1330._12_4_ = uVar48;
    auVar121 = ZEXT1664(local_1330);
    auVar81 = vmovshdup_avx(auVar82);
    local_1350 = vshufps_avx(auVar82,auVar82,0x55);
    auVar127 = ZEXT1664(local_1350);
    auVar90 = vshufpd_avx(auVar82,auVar82,1);
    local_1360 = vshufps_avx(auVar82,auVar82,0xaa);
    auVar128 = ZEXT1664(local_1360);
    local_1380 = vshufps_avx(auVar72,auVar72,0x55);
    auVar134 = ZEXT1664(local_1380);
    uVar41 = (ulong)(auVar82._0_4_ < 0.0) << 4;
    uVar42 = (ulong)(auVar81._0_4_ < 0.0) << 4 | 0x20;
    local_1390 = vshufps_avx(auVar72,auVar72,0xaa);
    auVar136 = ZEXT1664(local_1390);
    uVar40 = (ulong)(auVar90._0_4_ < 0.0) << 4 | 0x40;
    uVar44 = uVar41 ^ 0x10;
    uVar47 = uVar42 ^ 0x10;
    uVar48 = auVar55._0_4_;
    local_13f0._4_4_ = uVar48;
    local_13f0._0_4_ = uVar48;
    local_13f0._8_4_ = uVar48;
    local_13f0._12_4_ = uVar48;
    auVar105 = ZEXT1664(local_13f0);
    uVar48 = auVar61._0_4_;
    auVar54 = ZEXT1664(CONCAT412(uVar48,CONCAT48(uVar48,CONCAT44(uVar48,uVar48))));
    local_1100._16_16_ = mm_lookupmask_ps._240_16_;
    local_1100._0_16_ = mm_lookupmask_ps._0_16_;
    auVar52._8_4_ = 0x3f800000;
    auVar52._0_8_ = 0x3f8000003f800000;
    auVar52._12_4_ = 0x3f800000;
    auVar52._16_4_ = 0x3f800000;
    auVar52._20_4_ = 0x3f800000;
    auVar52._24_4_ = 0x3f800000;
    auVar52._28_4_ = 0x3f800000;
    auVar51._8_4_ = 0xbf800000;
    auVar51._0_8_ = 0xbf800000bf800000;
    auVar51._12_4_ = 0xbf800000;
    auVar51._16_4_ = 0xbf800000;
    auVar51._20_4_ = 0xbf800000;
    auVar51._24_4_ = 0xbf800000;
    auVar51._28_4_ = 0xbf800000;
    _local_1120 = vblendvps_avx(auVar52,auVar51,local_1100);
    local_1528 = context;
    local_1530 = ray;
    local_1538 = uVar41;
    local_1540 = uVar42;
    local_1340 = auVar82._0_4_;
    fStack_133c = auVar82._0_4_;
    fStack_1338 = auVar82._0_4_;
    fStack_1334 = auVar82._0_4_;
    local_1370 = auVar72._0_4_;
    fStack_136c = auVar72._0_4_;
    fStack_1368 = auVar72._0_4_;
    fStack_1364 = auVar72._0_4_;
    fVar124 = auVar82._0_4_;
    fVar125 = auVar82._0_4_;
    fVar126 = auVar82._0_4_;
    fVar130 = auVar72._0_4_;
    fVar131 = auVar72._0_4_;
    fVar132 = auVar72._0_4_;
LAB_0148eb70:
    if (pauVar43 != (undefined1 (*) [16])&local_fa0) {
      pauVar32 = pauVar43 + -1;
      pauVar43 = pauVar43 + -1;
      if (*(float *)(*pauVar32 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar46 = *(ulong *)*pauVar43;
        while ((uVar46 & 8) == 0) {
          auVar81 = vsubps_avx(*(undefined1 (*) [16])(uVar46 + 0x20 + uVar41),auVar112._0_16_);
          auVar55._0_4_ = auVar82._0_4_ * auVar81._0_4_;
          auVar55._4_4_ = fVar124 * auVar81._4_4_;
          auVar55._8_4_ = fVar125 * auVar81._8_4_;
          auVar55._12_4_ = fVar126 * auVar81._12_4_;
          auVar81 = vsubps_avx(*(undefined1 (*) [16])(uVar46 + 0x20 + uVar42),auVar118._0_16_);
          auVar61._0_4_ = auVar127._0_4_ * auVar81._0_4_;
          auVar61._4_4_ = auVar127._4_4_ * auVar81._4_4_;
          auVar61._8_4_ = auVar127._8_4_ * auVar81._8_4_;
          auVar61._12_4_ = auVar127._12_4_ * auVar81._12_4_;
          auVar81 = vmaxps_avx(auVar55,auVar61);
          auVar90 = vsubps_avx(*(undefined1 (*) [16])(uVar46 + 0x20 + uVar40),auVar121._0_16_);
          auVar62._0_4_ = auVar128._0_4_ * auVar90._0_4_;
          auVar62._4_4_ = auVar128._4_4_ * auVar90._4_4_;
          auVar62._8_4_ = auVar128._8_4_ * auVar90._8_4_;
          auVar62._12_4_ = auVar128._12_4_ * auVar90._12_4_;
          auVar90 = vmaxps_avx(auVar62,auVar105._0_16_);
          local_12e0 = vmaxps_avx(auVar81,auVar90);
          auVar81 = vsubps_avx(*(undefined1 (*) [16])(uVar46 + 0x20 + uVar44),auVar112._0_16_);
          auVar63._0_4_ = auVar72._0_4_ * auVar81._0_4_;
          auVar63._4_4_ = fVar130 * auVar81._4_4_;
          auVar63._8_4_ = fVar131 * auVar81._8_4_;
          auVar63._12_4_ = fVar132 * auVar81._12_4_;
          auVar81 = vsubps_avx(*(undefined1 (*) [16])(uVar46 + 0x20 + uVar47),auVar118._0_16_);
          auVar73._0_4_ = auVar134._0_4_ * auVar81._0_4_;
          auVar73._4_4_ = auVar134._4_4_ * auVar81._4_4_;
          auVar73._8_4_ = auVar134._8_4_ * auVar81._8_4_;
          auVar73._12_4_ = auVar134._12_4_ * auVar81._12_4_;
          auVar81 = vminps_avx(auVar63,auVar73);
          auVar90 = vsubps_avx(*(undefined1 (*) [16])(uVar46 + 0x20 + (uVar40 ^ 0x10)),
                               auVar121._0_16_);
          auVar74._0_4_ = auVar136._0_4_ * auVar90._0_4_;
          auVar74._4_4_ = auVar136._4_4_ * auVar90._4_4_;
          auVar74._8_4_ = auVar136._8_4_ * auVar90._8_4_;
          auVar74._12_4_ = auVar136._12_4_ * auVar90._12_4_;
          auVar90 = vminps_avx(auVar74,auVar54._0_16_);
          auVar81 = vminps_avx(auVar81,auVar90);
          auVar81 = vcmpps_avx(local_12e0,auVar81,2);
          uVar33 = vmovmskps_avx(auVar81);
          if (uVar33 == 0) goto LAB_0148eb70;
          uVar33 = uVar33 & 0xff;
          uVar45 = uVar46 & 0xfffffffffffffff0;
          lVar17 = 0;
          for (uVar46 = (ulong)uVar33; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000)
          {
            lVar17 = lVar17 + 1;
          }
          uVar46 = *(ulong *)(uVar45 + lVar17 * 8);
          uVar33 = uVar33 - 1 & uVar33;
          uVar37 = (ulong)uVar33;
          if (uVar33 != 0) {
            uVar36 = *(uint *)(local_12e0 + lVar17 * 4);
            lVar17 = 0;
            for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
              lVar17 = lVar17 + 1;
            }
            uVar33 = uVar33 - 1 & uVar33;
            uVar38 = (ulong)uVar33;
            uVar37 = *(ulong *)(uVar45 + lVar17 * 8);
            uVar35 = *(uint *)(local_12e0 + lVar17 * 4);
            if (uVar33 == 0) {
              if (uVar36 < uVar35) {
                *(ulong *)*pauVar43 = uVar37;
                *(uint *)(*pauVar43 + 8) = uVar35;
                pauVar43 = pauVar43 + 1;
              }
              else {
                *(ulong *)*pauVar43 = uVar46;
                *(uint *)(*pauVar43 + 8) = uVar36;
                pauVar43 = pauVar43 + 1;
                uVar46 = uVar37;
              }
            }
            else {
              auVar56._8_8_ = 0;
              auVar56._0_8_ = uVar46;
              auVar81 = vpunpcklqdq_avx(auVar56,ZEXT416(uVar36));
              auVar64._8_8_ = 0;
              auVar64._0_8_ = uVar37;
              auVar90 = vpunpcklqdq_avx(auVar64,ZEXT416(uVar35));
              lVar17 = 0;
              for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
                lVar17 = lVar17 + 1;
              }
              uVar33 = uVar33 - 1 & uVar33;
              uVar46 = (ulong)uVar33;
              auVar75._8_8_ = 0;
              auVar75._0_8_ = *(ulong *)(uVar45 + lVar17 * 8);
              auVar61 = vpunpcklqdq_avx(auVar75,ZEXT416(*(uint *)(local_12e0 + lVar17 * 4)));
              auVar55 = vpcmpgtd_avx(auVar90,auVar81);
              if (uVar33 == 0) {
                auVar91 = vpshufd_avx(auVar55,0xaa);
                auVar55 = vblendvps_avx(auVar90,auVar81,auVar91);
                auVar81 = vblendvps_avx(auVar81,auVar90,auVar91);
                auVar90 = vpcmpgtd_avx(auVar61,auVar55);
                auVar91 = vpshufd_avx(auVar90,0xaa);
                auVar90 = vblendvps_avx(auVar61,auVar55,auVar91);
                auVar55 = vblendvps_avx(auVar55,auVar61,auVar91);
                auVar61 = vpcmpgtd_avx(auVar55,auVar81);
                auVar91 = vpshufd_avx(auVar61,0xaa);
                auVar61 = vblendvps_avx(auVar55,auVar81,auVar91);
                auVar81 = vblendvps_avx(auVar81,auVar55,auVar91);
                *pauVar43 = auVar81;
                pauVar43[1] = auVar61;
                uVar46 = auVar90._0_8_;
                pauVar43 = pauVar43 + 2;
              }
              else {
                lVar17 = 0;
                for (; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
                  lVar17 = lVar17 + 1;
                }
                auVar93._8_8_ = 0;
                auVar93._0_8_ = *(ulong *)(uVar45 + lVar17 * 8);
                auVar92 = vpunpcklqdq_avx(auVar93,ZEXT416(*(uint *)(local_12e0 + lVar17 * 4)));
                auVar91 = vpshufd_avx(auVar55,0xaa);
                auVar55 = vblendvps_avx(auVar90,auVar81,auVar91);
                auVar81 = vblendvps_avx(auVar81,auVar90,auVar91);
                auVar90 = vpcmpgtd_avx(auVar92,auVar61);
                auVar91 = vpshufd_avx(auVar90,0xaa);
                auVar90 = vblendvps_avx(auVar92,auVar61,auVar91);
                auVar61 = vblendvps_avx(auVar61,auVar92,auVar91);
                auVar91 = vpcmpgtd_avx(auVar61,auVar81);
                auVar92 = vpshufd_avx(auVar91,0xaa);
                auVar91 = vblendvps_avx(auVar61,auVar81,auVar92);
                auVar81 = vblendvps_avx(auVar81,auVar61,auVar92);
                auVar61 = vpcmpgtd_avx(auVar90,auVar55);
                auVar92 = vpshufd_avx(auVar61,0xaa);
                auVar61 = vblendvps_avx(auVar90,auVar55,auVar92);
                auVar90 = vblendvps_avx(auVar55,auVar90,auVar92);
                auVar55 = vpcmpgtd_avx(auVar91,auVar90);
                auVar92 = vpshufd_avx(auVar55,0xaa);
                auVar55 = vblendvps_avx(auVar91,auVar90,auVar92);
                auVar90 = vblendvps_avx(auVar90,auVar91,auVar92);
                *pauVar43 = auVar81;
                pauVar43[1] = auVar90;
                pauVar43[2] = auVar55;
                auVar105 = ZEXT1664(local_13f0);
                uVar46 = auVar61._0_8_;
                pauVar43 = pauVar43 + 3;
              }
            }
          }
        }
        local_14c0 = (ulong)((uint)uVar46 & 0xf) - 8;
        uVar46 = uVar46 & 0xfffffffffffffff0;
        for (local_14b8 = 0; local_14b8 != local_14c0; local_14b8 = local_14b8 + 1) {
          lVar34 = local_14b8 * 0xe0;
          lVar17 = uVar46 + 0xd0 + lVar34;
          local_1300 = *(undefined8 *)(lVar17 + 0x10);
          uStack_12f8 = *(undefined8 *)(lVar17 + 0x18);
          lVar17 = uVar46 + 0xc0 + lVar34;
          local_fc0 = *(undefined8 *)(lVar17 + 0x10);
          uStack_fb8 = *(undefined8 *)(lVar17 + 0x18);
          uStack_fb0 = local_fc0;
          uStack_fa8 = uStack_fb8;
          uStack_12f0 = local_1300;
          uStack_12e8 = uStack_12f8;
          auVar49._16_16_ = *(undefined1 (*) [16])(uVar46 + 0x60 + lVar34);
          auVar49._0_16_ = *(undefined1 (*) [16])(uVar46 + lVar34);
          auVar57._16_16_ = *(undefined1 (*) [16])(uVar46 + 0x70 + lVar34);
          auVar57._0_16_ = *(undefined1 (*) [16])(uVar46 + 0x10 + lVar34);
          auVar65._16_16_ = *(undefined1 (*) [16])(uVar46 + 0x80 + lVar34);
          auVar65._0_16_ = *(undefined1 (*) [16])(uVar46 + 0x20 + lVar34);
          auVar81 = *(undefined1 (*) [16])(uVar46 + 0x30 + lVar34);
          auVar76._16_16_ = auVar81;
          auVar76._0_16_ = auVar81;
          auVar81 = *(undefined1 (*) [16])(uVar46 + 0x40 + lVar34);
          auVar83._16_16_ = auVar81;
          auVar83._0_16_ = auVar81;
          auVar81 = *(undefined1 (*) [16])(uVar46 + 0x50 + lVar34);
          auVar94._16_16_ = auVar81;
          auVar94._0_16_ = auVar81;
          auVar81 = *(undefined1 (*) [16])(uVar46 + 0x90 + lVar34);
          auVar103._16_16_ = auVar81;
          auVar103._0_16_ = auVar81;
          auVar81 = *(undefined1 (*) [16])(uVar46 + 0xa0 + lVar34);
          auVar135._16_16_ = auVar81;
          auVar135._0_16_ = auVar81;
          auVar81 = *(undefined1 (*) [16])(uVar46 + 0xb0 + lVar34);
          auVar119._16_16_ = auVar81;
          auVar119._0_16_ = auVar81;
          uVar48 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar122._4_4_ = uVar48;
          auVar122._0_4_ = uVar48;
          auVar122._8_4_ = uVar48;
          auVar122._12_4_ = uVar48;
          auVar122._16_4_ = uVar48;
          auVar122._20_4_ = uVar48;
          auVar122._24_4_ = uVar48;
          auVar122._28_4_ = uVar48;
          uVar48 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar129._4_4_ = uVar48;
          auVar129._0_4_ = uVar48;
          auVar129._8_4_ = uVar48;
          auVar129._12_4_ = uVar48;
          auVar129._16_4_ = uVar48;
          auVar129._20_4_ = uVar48;
          auVar129._24_4_ = uVar48;
          auVar129._28_4_ = uVar48;
          uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar133._4_4_ = uVar1;
          auVar133._0_4_ = uVar1;
          auVar133._8_4_ = uVar1;
          auVar133._12_4_ = uVar1;
          auVar133._16_4_ = uVar1;
          auVar133._20_4_ = uVar1;
          auVar133._24_4_ = uVar1;
          auVar133._28_4_ = uVar1;
          local_13c0 = vsubps_avx(auVar49,auVar122);
          local_13e0 = vsubps_avx(auVar57,auVar129);
          local_fe0 = vsubps_avx(auVar65,auVar133);
          auVar51 = vsubps_avx(auVar76,auVar122);
          local_1520 = vsubps_avx(auVar83,auVar129);
          auVar52 = vsubps_avx(auVar94,auVar133);
          auVar68 = vsubps_avx(auVar103,auVar122);
          auVar49 = vsubps_avx(auVar135,auVar129);
          auVar14 = vsubps_avx(auVar119,auVar133);
          local_1000 = vsubps_avx(auVar68,local_13c0);
          local_1040 = vsubps_avx(auVar49,local_13e0);
          local_1020 = vsubps_avx(auVar14,local_fe0);
          auVar50._0_4_ = auVar68._0_4_ + local_13c0._0_4_;
          auVar50._4_4_ = auVar68._4_4_ + local_13c0._4_4_;
          auVar50._8_4_ = auVar68._8_4_ + local_13c0._8_4_;
          auVar50._12_4_ = auVar68._12_4_ + local_13c0._12_4_;
          auVar50._16_4_ = auVar68._16_4_ + local_13c0._16_4_;
          auVar50._20_4_ = auVar68._20_4_ + local_13c0._20_4_;
          auVar50._24_4_ = auVar68._24_4_ + local_13c0._24_4_;
          auVar50._28_4_ = auVar68._28_4_ + local_13c0._28_4_;
          auVar77._0_4_ = auVar49._0_4_ + local_13e0._0_4_;
          auVar77._4_4_ = auVar49._4_4_ + local_13e0._4_4_;
          auVar77._8_4_ = auVar49._8_4_ + local_13e0._8_4_;
          auVar77._12_4_ = auVar49._12_4_ + local_13e0._12_4_;
          auVar77._16_4_ = auVar49._16_4_ + local_13e0._16_4_;
          auVar77._20_4_ = auVar49._20_4_ + local_13e0._20_4_;
          auVar77._24_4_ = auVar49._24_4_ + local_13e0._24_4_;
          auVar77._28_4_ = auVar49._28_4_ + local_13e0._28_4_;
          fVar124 = local_fe0._0_4_;
          auVar84._0_4_ = auVar14._0_4_ + fVar124;
          fVar125 = local_fe0._4_4_;
          auVar84._4_4_ = auVar14._4_4_ + fVar125;
          fVar126 = local_fe0._8_4_;
          auVar84._8_4_ = auVar14._8_4_ + fVar126;
          auVar82._0_4_ = local_fe0._12_4_;
          auVar84._12_4_ = auVar14._12_4_ + auVar82._0_4_;
          fVar130 = local_fe0._16_4_;
          auVar84._16_4_ = auVar14._16_4_ + fVar130;
          fVar131 = local_fe0._20_4_;
          auVar84._20_4_ = auVar14._20_4_ + fVar131;
          fVar132 = local_fe0._24_4_;
          auVar84._24_4_ = auVar14._24_4_ + fVar132;
          auVar84._28_4_ = auVar14._28_4_ + local_fe0._28_4_;
          auVar15._4_4_ = local_1020._4_4_ * auVar77._4_4_;
          auVar15._0_4_ = local_1020._0_4_ * auVar77._0_4_;
          auVar15._8_4_ = local_1020._8_4_ * auVar77._8_4_;
          auVar15._12_4_ = local_1020._12_4_ * auVar77._12_4_;
          auVar15._16_4_ = local_1020._16_4_ * auVar77._16_4_;
          auVar15._20_4_ = local_1020._20_4_ * auVar77._20_4_;
          auVar15._24_4_ = local_1020._24_4_ * auVar77._24_4_;
          auVar15._28_4_ = uVar48;
          auVar90 = vfmsub231ps_fma(auVar15,local_1040,auVar84);
          auVar16._4_4_ = auVar84._4_4_ * local_1000._4_4_;
          auVar16._0_4_ = auVar84._0_4_ * local_1000._0_4_;
          auVar16._8_4_ = auVar84._8_4_ * local_1000._8_4_;
          auVar16._12_4_ = auVar84._12_4_ * local_1000._12_4_;
          auVar16._16_4_ = auVar84._16_4_ * local_1000._16_4_;
          auVar16._20_4_ = auVar84._20_4_ * local_1000._20_4_;
          auVar16._24_4_ = auVar84._24_4_ * local_1000._24_4_;
          auVar16._28_4_ = auVar84._28_4_;
          auVar55 = vfmsub231ps_fma(auVar16,local_1020,auVar50);
          auVar18._4_4_ = auVar50._4_4_ * local_1040._4_4_;
          auVar18._0_4_ = auVar50._0_4_ * local_1040._0_4_;
          auVar18._8_4_ = auVar50._8_4_ * local_1040._8_4_;
          auVar18._12_4_ = auVar50._12_4_ * local_1040._12_4_;
          auVar18._16_4_ = auVar50._16_4_ * local_1040._16_4_;
          auVar18._20_4_ = auVar50._20_4_ * local_1040._20_4_;
          auVar18._24_4_ = auVar50._24_4_ * local_1040._24_4_;
          auVar18._28_4_ = auVar50._28_4_;
          auVar61 = vfmsub231ps_fma(auVar18,local_1000,auVar77);
          uVar48 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
          local_14e0._4_4_ = uVar48;
          local_14e0._0_4_ = uVar48;
          local_14e0._8_4_ = uVar48;
          local_14e0._12_4_ = uVar48;
          local_14e0._16_4_ = uVar48;
          local_14e0._20_4_ = uVar48;
          local_14e0._24_4_ = uVar48;
          local_14e0._28_4_ = uVar48;
          local_1480._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
          auVar19._4_4_ = local_1480._4_4_ * auVar61._4_4_;
          auVar19._0_4_ = local_1480._4_4_ * auVar61._0_4_;
          auVar19._8_4_ = local_1480._4_4_ * auVar61._8_4_;
          auVar19._12_4_ = local_1480._4_4_ * auVar61._12_4_;
          auVar19._16_4_ = local_1480._4_4_ * 0.0;
          auVar19._20_4_ = local_1480._4_4_ * 0.0;
          auVar19._24_4_ = local_1480._4_4_ * 0.0;
          auVar19._28_4_ = auVar81._12_4_;
          auVar81 = vfmadd231ps_fma(auVar19,local_14e0,ZEXT1632(auVar55));
          uVar48 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
          local_1500._4_4_ = uVar48;
          local_1500._0_4_ = uVar48;
          local_1500._8_4_ = uVar48;
          local_1500._12_4_ = uVar48;
          local_1500._16_4_ = uVar48;
          local_1500._20_4_ = uVar48;
          local_1500._24_4_ = uVar48;
          local_1500._28_4_ = uVar48;
          local_12e0 = vfmadd231ps_fma(ZEXT1632(auVar81),local_1500,ZEXT1632(auVar90));
          local_1060 = vsubps_avx(local_13e0,local_1520);
          local_10a0 = vsubps_avx(local_fe0,auVar52);
          auVar78._0_4_ = local_13e0._0_4_ + local_1520._0_4_;
          auVar78._4_4_ = local_13e0._4_4_ + local_1520._4_4_;
          auVar78._8_4_ = local_13e0._8_4_ + local_1520._8_4_;
          auVar78._12_4_ = local_13e0._12_4_ + local_1520._12_4_;
          auVar78._16_4_ = local_13e0._16_4_ + local_1520._16_4_;
          auVar78._20_4_ = local_13e0._20_4_ + local_1520._20_4_;
          auVar78._24_4_ = local_13e0._24_4_ + local_1520._24_4_;
          auVar78._28_4_ = local_13e0._28_4_ + local_1520._28_4_;
          auVar85._0_4_ = auVar52._0_4_ + fVar124;
          auVar85._4_4_ = auVar52._4_4_ + fVar125;
          auVar85._8_4_ = auVar52._8_4_ + fVar126;
          auVar85._12_4_ = auVar52._12_4_ + auVar82._0_4_;
          auVar85._16_4_ = auVar52._16_4_ + fVar130;
          auVar85._20_4_ = auVar52._20_4_ + fVar131;
          auVar85._24_4_ = auVar52._24_4_ + fVar132;
          auVar85._28_4_ = auVar52._28_4_ + local_fe0._28_4_;
          auVar72._0_4_ = local_10a0._0_4_;
          fVar71 = local_10a0._4_4_;
          auVar20._4_4_ = auVar78._4_4_ * fVar71;
          auVar20._0_4_ = auVar78._0_4_ * auVar72._0_4_;
          fVar97 = local_10a0._8_4_;
          auVar20._8_4_ = auVar78._8_4_ * fVar97;
          fVar100 = local_10a0._12_4_;
          auVar20._12_4_ = auVar78._12_4_ * fVar100;
          fVar5 = local_10a0._16_4_;
          auVar20._16_4_ = auVar78._16_4_ * fVar5;
          fVar8 = local_10a0._20_4_;
          auVar20._20_4_ = auVar78._20_4_ * fVar8;
          fVar11 = local_10a0._24_4_;
          auVar20._24_4_ = auVar78._24_4_ * fVar11;
          auVar20._28_4_ = local_1000._28_4_;
          auVar90 = vfmsub231ps_fma(auVar20,local_1060,auVar85);
          local_1080 = vsubps_avx(local_13c0,auVar51);
          fVar69 = local_1080._0_4_;
          fVar89 = local_1080._4_4_;
          auVar21._4_4_ = auVar85._4_4_ * fVar89;
          auVar21._0_4_ = auVar85._0_4_ * fVar69;
          fVar98 = local_1080._8_4_;
          auVar21._8_4_ = auVar85._8_4_ * fVar98;
          fVar101 = local_1080._12_4_;
          auVar21._12_4_ = auVar85._12_4_ * fVar101;
          fVar6 = local_1080._16_4_;
          auVar21._16_4_ = auVar85._16_4_ * fVar6;
          fVar9 = local_1080._20_4_;
          auVar21._20_4_ = auVar85._20_4_ * fVar9;
          fVar12 = local_1080._24_4_;
          auVar21._24_4_ = auVar85._24_4_ * fVar12;
          auVar21._28_4_ = auVar85._28_4_;
          auVar113._0_4_ = local_13c0._0_4_ + auVar51._0_4_;
          auVar113._4_4_ = local_13c0._4_4_ + auVar51._4_4_;
          auVar113._8_4_ = local_13c0._8_4_ + auVar51._8_4_;
          auVar113._12_4_ = local_13c0._12_4_ + auVar51._12_4_;
          auVar113._16_4_ = local_13c0._16_4_ + auVar51._16_4_;
          auVar113._20_4_ = local_13c0._20_4_ + auVar51._20_4_;
          auVar113._24_4_ = local_13c0._24_4_ + auVar51._24_4_;
          auVar113._28_4_ = local_13c0._28_4_ + auVar51._28_4_;
          auVar81 = vfmsub231ps_fma(auVar21,local_10a0,auVar113);
          fVar70 = local_1060._0_4_;
          fVar96 = local_1060._4_4_;
          auVar22._4_4_ = auVar113._4_4_ * fVar96;
          auVar22._0_4_ = auVar113._0_4_ * fVar70;
          fVar99 = local_1060._8_4_;
          auVar22._8_4_ = auVar113._8_4_ * fVar99;
          fVar4 = local_1060._12_4_;
          auVar22._12_4_ = auVar113._12_4_ * fVar4;
          fVar7 = local_1060._16_4_;
          auVar22._16_4_ = auVar113._16_4_ * fVar7;
          fVar10 = local_1060._20_4_;
          auVar22._20_4_ = auVar113._20_4_ * fVar10;
          fVar13 = local_1060._24_4_;
          auVar22._24_4_ = auVar113._24_4_ * fVar13;
          auVar22._28_4_ = auVar113._28_4_;
          auVar55 = vfmsub231ps_fma(auVar22,local_1080,auVar78);
          auVar23._4_4_ = local_1480._4_4_ * auVar55._4_4_;
          auVar23._0_4_ = local_1480._4_4_ * auVar55._0_4_;
          auVar23._8_4_ = local_1480._4_4_ * auVar55._8_4_;
          auVar23._12_4_ = local_1480._4_4_ * auVar55._12_4_;
          auVar23._16_4_ = local_1480._4_4_ * 0.0;
          auVar23._20_4_ = local_1480._4_4_ * 0.0;
          auVar23._24_4_ = local_1480._4_4_ * 0.0;
          auVar23._28_4_ = auVar78._28_4_;
          auVar81 = vfmadd231ps_fma(auVar23,local_14e0,ZEXT1632(auVar81));
          auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),local_1500,ZEXT1632(auVar90));
          auVar15 = vsubps_avx(auVar51,auVar68);
          auVar66._0_4_ = auVar51._0_4_ + auVar68._0_4_;
          auVar66._4_4_ = auVar51._4_4_ + auVar68._4_4_;
          auVar66._8_4_ = auVar51._8_4_ + auVar68._8_4_;
          auVar66._12_4_ = auVar51._12_4_ + auVar68._12_4_;
          auVar66._16_4_ = auVar51._16_4_ + auVar68._16_4_;
          auVar66._20_4_ = auVar51._20_4_ + auVar68._20_4_;
          auVar66._24_4_ = auVar51._24_4_ + auVar68._24_4_;
          auVar66._28_4_ = auVar51._28_4_ + auVar68._28_4_;
          auVar16 = vsubps_avx(local_1520,auVar49);
          auVar95._0_4_ = local_1520._0_4_ + auVar49._0_4_;
          auVar95._4_4_ = local_1520._4_4_ + auVar49._4_4_;
          auVar95._8_4_ = local_1520._8_4_ + auVar49._8_4_;
          auVar95._12_4_ = local_1520._12_4_ + auVar49._12_4_;
          auVar95._16_4_ = local_1520._16_4_ + auVar49._16_4_;
          auVar95._20_4_ = local_1520._20_4_ + auVar49._20_4_;
          auVar95._24_4_ = local_1520._24_4_ + auVar49._24_4_;
          auVar95._28_4_ = local_1520._28_4_ + auVar49._28_4_;
          auVar49 = vsubps_avx(auVar52,auVar14);
          auVar58._0_4_ = auVar52._0_4_ + auVar14._0_4_;
          auVar58._4_4_ = auVar52._4_4_ + auVar14._4_4_;
          auVar58._8_4_ = auVar52._8_4_ + auVar14._8_4_;
          auVar58._12_4_ = auVar52._12_4_ + auVar14._12_4_;
          auVar58._16_4_ = auVar52._16_4_ + auVar14._16_4_;
          auVar58._20_4_ = auVar52._20_4_ + auVar14._20_4_;
          auVar58._24_4_ = auVar52._24_4_ + auVar14._24_4_;
          auVar58._28_4_ = auVar52._28_4_ + auVar14._28_4_;
          auVar104._0_4_ = auVar49._0_4_ * auVar95._0_4_;
          auVar104._4_4_ = auVar49._4_4_ * auVar95._4_4_;
          auVar104._8_4_ = auVar49._8_4_ * auVar95._8_4_;
          auVar104._12_4_ = auVar49._12_4_ * auVar95._12_4_;
          auVar104._16_4_ = auVar49._16_4_ * auVar95._16_4_;
          auVar104._20_4_ = auVar49._20_4_ * auVar95._20_4_;
          auVar104._24_4_ = auVar49._24_4_ * auVar95._24_4_;
          auVar104._28_4_ = 0;
          auVar55 = vfmsub231ps_fma(auVar104,auVar16,auVar58);
          auVar68._4_4_ = auVar58._4_4_ * auVar15._4_4_;
          auVar68._0_4_ = auVar58._0_4_ * auVar15._0_4_;
          auVar68._8_4_ = auVar58._8_4_ * auVar15._8_4_;
          auVar68._12_4_ = auVar58._12_4_ * auVar15._12_4_;
          auVar68._16_4_ = auVar58._16_4_ * auVar15._16_4_;
          auVar68._20_4_ = auVar58._20_4_ * auVar15._20_4_;
          auVar68._24_4_ = auVar58._24_4_ * auVar15._24_4_;
          auVar68._28_4_ = auVar58._28_4_;
          auVar90 = vfmsub231ps_fma(auVar68,auVar49,auVar66);
          auVar14._4_4_ = auVar16._4_4_ * auVar66._4_4_;
          auVar14._0_4_ = auVar16._0_4_ * auVar66._0_4_;
          auVar14._8_4_ = auVar16._8_4_ * auVar66._8_4_;
          auVar14._12_4_ = auVar16._12_4_ * auVar66._12_4_;
          auVar14._16_4_ = auVar16._16_4_ * auVar66._16_4_;
          auVar14._20_4_ = auVar16._20_4_ * auVar66._20_4_;
          auVar14._24_4_ = auVar16._24_4_ * auVar66._24_4_;
          auVar14._28_4_ = auVar66._28_4_;
          auVar61 = vfmsub231ps_fma(auVar14,auVar15,auVar95);
          local_1480._0_4_ = local_1480._4_4_;
          fStack_1478 = local_1480._4_4_;
          fStack_1474 = local_1480._4_4_;
          fStack_1470 = local_1480._4_4_;
          fStack_146c = local_1480._4_4_;
          fStack_1468 = local_1480._4_4_;
          fStack_1464 = local_1480._4_4_;
          auVar67._0_4_ = local_1480._4_4_ * auVar61._0_4_;
          auVar67._4_4_ = local_1480._4_4_ * auVar61._4_4_;
          auVar67._8_4_ = local_1480._4_4_ * auVar61._8_4_;
          auVar67._12_4_ = local_1480._4_4_ * auVar61._12_4_;
          auVar67._16_4_ = local_1480._4_4_ * 0.0;
          auVar67._20_4_ = local_1480._4_4_ * 0.0;
          auVar67._24_4_ = local_1480._4_4_ * 0.0;
          auVar67._28_4_ = 0;
          auVar90 = vfmadd231ps_fma(auVar67,local_14e0,ZEXT1632(auVar90));
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),local_1500,ZEXT1632(auVar55));
          local_12a0 = ZEXT1632(CONCAT412(auVar90._12_4_ + local_12e0._12_4_ + auVar81._12_4_,
                                          CONCAT48(auVar90._8_4_ + local_12e0._8_4_ + auVar81._8_4_,
                                                   CONCAT44(auVar90._4_4_ +
                                                            local_12e0._4_4_ + auVar81._4_4_,
                                                            auVar90._0_4_ +
                                                            local_12e0._0_4_ + auVar81._0_4_))));
          auVar59._8_4_ = 0x7fffffff;
          auVar59._0_8_ = 0x7fffffff7fffffff;
          auVar59._12_4_ = 0x7fffffff;
          auVar59._16_4_ = 0x7fffffff;
          auVar59._20_4_ = 0x7fffffff;
          auVar59._24_4_ = 0x7fffffff;
          auVar59._28_4_ = 0x7fffffff;
          local_1520 = ZEXT1632(local_12e0);
          auVar51 = vminps_avx(local_1520,ZEXT1632(auVar81));
          auVar51 = vminps_avx(auVar51,ZEXT1632(auVar90));
          local_10c0 = vandps_avx(local_12a0,auVar59);
          fVar102 = local_10c0._0_4_ * 1.1920929e-07;
          fVar106 = local_10c0._4_4_ * 1.1920929e-07;
          auVar24._4_4_ = fVar106;
          auVar24._0_4_ = fVar102;
          fVar107 = local_10c0._8_4_ * 1.1920929e-07;
          auVar24._8_4_ = fVar107;
          fVar108 = local_10c0._12_4_ * 1.1920929e-07;
          auVar24._12_4_ = fVar108;
          fVar109 = local_10c0._16_4_ * 1.1920929e-07;
          auVar24._16_4_ = fVar109;
          fVar110 = local_10c0._20_4_ * 1.1920929e-07;
          auVar24._20_4_ = fVar110;
          fVar111 = local_10c0._24_4_ * 1.1920929e-07;
          auVar24._24_4_ = fVar111;
          auVar24._28_4_ = 0x34000000;
          auVar114._0_8_ = CONCAT44(fVar106,fVar102) ^ 0x8000000080000000;
          auVar114._8_4_ = -fVar107;
          auVar114._12_4_ = -fVar108;
          auVar114._16_4_ = -fVar109;
          auVar114._20_4_ = -fVar110;
          auVar114._24_4_ = -fVar111;
          auVar114._28_4_ = 0xb4000000;
          auVar51 = vcmpps_avx(auVar51,auVar114,5);
          auVar68 = vmaxps_avx(local_1520,ZEXT1632(auVar81));
          auVar52 = vmaxps_avx(auVar68,ZEXT1632(auVar90));
          auVar52 = vcmpps_avx(auVar52,auVar24,2);
          auVar52 = vorps_avx(auVar51,auVar52);
          if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar52 >> 0x7f,0) != '\0') ||
                (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar52 >> 0xbf,0) != '\0') ||
              (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar52[0x1f] < '\0') {
            local_10e0 = 0x80000000;
            uStack_10dc = 0x80000000;
            uStack_10d8 = 0x80000000;
            uStack_10d4 = 0x80000000;
            uStack_10d0 = 0x80000000;
            uStack_10cc = 0x80000000;
            uStack_10c8 = 0x80000000;
            uStack_10c4 = 0x80000000;
            auVar25._4_4_ = fVar96 * local_1020._4_4_;
            auVar25._0_4_ = fVar70 * local_1020._0_4_;
            auVar25._8_4_ = fVar99 * local_1020._8_4_;
            auVar25._12_4_ = fVar4 * local_1020._12_4_;
            auVar25._16_4_ = fVar7 * local_1020._16_4_;
            auVar25._20_4_ = fVar10 * local_1020._20_4_;
            auVar25._24_4_ = fVar13 * local_1020._24_4_;
            auVar25._28_4_ = auVar51._28_4_;
            auVar26._4_4_ = local_1040._4_4_ * fVar89;
            auVar26._0_4_ = local_1040._0_4_ * fVar69;
            auVar26._8_4_ = local_1040._8_4_ * fVar98;
            auVar26._12_4_ = local_1040._12_4_ * fVar101;
            auVar26._16_4_ = local_1040._16_4_ * fVar6;
            auVar26._20_4_ = local_1040._20_4_ * fVar9;
            auVar26._24_4_ = local_1040._24_4_ * fVar12;
            auVar26._28_4_ = auVar68._28_4_;
            auVar90 = vfmsub213ps_fma(local_1040,local_10a0,auVar25);
            auVar27._4_4_ = fVar71 * auVar16._4_4_;
            auVar27._0_4_ = auVar72._0_4_ * auVar16._0_4_;
            auVar27._8_4_ = fVar97 * auVar16._8_4_;
            auVar27._12_4_ = fVar100 * auVar16._12_4_;
            auVar27._16_4_ = fVar5 * auVar16._16_4_;
            auVar27._20_4_ = fVar8 * auVar16._20_4_;
            auVar27._24_4_ = fVar11 * auVar16._24_4_;
            auVar27._28_4_ = 0x34000000;
            auVar120._0_4_ = fVar69 * auVar49._0_4_;
            auVar120._4_4_ = fVar89 * auVar49._4_4_;
            auVar120._8_4_ = fVar98 * auVar49._8_4_;
            auVar120._12_4_ = fVar101 * auVar49._12_4_;
            auVar120._16_4_ = fVar6 * auVar49._16_4_;
            auVar120._20_4_ = fVar9 * auVar49._20_4_;
            auVar120._24_4_ = fVar12 * auVar49._24_4_;
            auVar120._28_4_ = 0;
            auVar55 = vfmsub213ps_fma(auVar49,local_1060,auVar27);
            auVar51 = vandps_avx(auVar25,auVar59);
            auVar68 = vandps_avx(auVar27,auVar59);
            auVar51 = vcmpps_avx(auVar51,auVar68,1);
            local_1280 = vblendvps_avx(ZEXT1632(auVar55),ZEXT1632(auVar90),auVar51);
            auVar28._4_4_ = fVar96 * auVar15._4_4_;
            auVar28._0_4_ = fVar70 * auVar15._0_4_;
            auVar28._8_4_ = fVar99 * auVar15._8_4_;
            auVar28._12_4_ = fVar4 * auVar15._12_4_;
            auVar28._16_4_ = fVar7 * auVar15._16_4_;
            auVar28._20_4_ = fVar10 * auVar15._20_4_;
            auVar28._24_4_ = fVar13 * auVar15._24_4_;
            auVar28._28_4_ = auVar51._28_4_;
            auVar90 = vfmsub213ps_fma(auVar15,local_10a0,auVar120);
            auVar29._4_4_ = local_1000._4_4_ * fVar71;
            auVar29._0_4_ = local_1000._0_4_ * auVar72._0_4_;
            auVar29._8_4_ = local_1000._8_4_ * fVar97;
            auVar29._12_4_ = local_1000._12_4_ * fVar100;
            auVar29._16_4_ = local_1000._16_4_ * fVar5;
            auVar29._20_4_ = local_1000._20_4_ * fVar8;
            auVar29._24_4_ = local_1000._24_4_ * fVar11;
            auVar29._28_4_ = auVar68._28_4_;
            auVar55 = vfmsub213ps_fma(local_1020,local_1080,auVar29);
            auVar51 = vandps_avx(auVar29,auVar59);
            auVar68 = vandps_avx(auVar120,auVar59);
            auVar51 = vcmpps_avx(auVar51,auVar68,1);
            local_1260 = vblendvps_avx(ZEXT1632(auVar90),ZEXT1632(auVar55),auVar51);
            auVar90 = vfmsub213ps_fma(local_1000,local_1060,auVar26);
            auVar55 = vfmsub213ps_fma(auVar16,local_1080,auVar28);
            auVar51 = vandps_avx(auVar26,auVar59);
            auVar68 = vandps_avx(auVar28,auVar59);
            auVar51 = vcmpps_avx(auVar51,auVar68,1);
            local_1240 = vblendvps_avx(ZEXT1632(auVar55),ZEXT1632(auVar90),auVar51);
            auVar90 = vpackssdw_avx(auVar52._0_16_,auVar52._16_16_);
            fVar89 = local_1240._0_4_;
            fVar96 = local_1240._4_4_;
            auVar30._4_4_ = fVar96 * local_1480._4_4_;
            auVar30._0_4_ = fVar89 * local_1480._4_4_;
            fVar97 = local_1240._8_4_;
            auVar30._8_4_ = fVar97 * local_1480._4_4_;
            fVar98 = local_1240._12_4_;
            auVar30._12_4_ = fVar98 * local_1480._4_4_;
            fVar99 = local_1240._16_4_;
            auVar30._16_4_ = fVar99 * local_1480._4_4_;
            fVar100 = local_1240._20_4_;
            auVar30._20_4_ = fVar100 * local_1480._4_4_;
            fVar101 = local_1240._24_4_;
            auVar30._24_4_ = fVar101 * local_1480._4_4_;
            auVar30._28_4_ = auVar52._28_4_;
            auVar55 = vfmadd213ps_fma(local_14e0,local_1260,auVar30);
            auVar55 = vfmadd213ps_fma(local_1500,local_1280,ZEXT1632(auVar55));
            auVar72._0_4_ = auVar55._0_4_ + auVar55._0_4_;
            fVar69 = auVar55._4_4_ + auVar55._4_4_;
            fVar70 = auVar55._8_4_ + auVar55._8_4_;
            fVar71 = auVar55._12_4_ + auVar55._12_4_;
            auVar68 = ZEXT1632(CONCAT412(fVar71,CONCAT48(fVar70,CONCAT44(fVar69,auVar72._0_4_))));
            auVar86._0_4_ = fVar89 * fVar124;
            auVar86._4_4_ = fVar96 * fVar125;
            auVar86._8_4_ = fVar97 * fVar126;
            auVar86._12_4_ = fVar98 * auVar82._0_4_;
            auVar86._16_4_ = fVar99 * fVar130;
            auVar86._20_4_ = fVar100 * fVar131;
            auVar86._24_4_ = fVar101 * fVar132;
            auVar86._28_4_ = 0;
            auVar55 = vfmadd213ps_fma(local_13e0,local_1260,auVar86);
            auVar61 = vfmadd213ps_fma(local_13c0,local_1280,ZEXT1632(auVar55));
            auVar51 = vrcpps_avx(auVar68);
            auVar123._8_4_ = 0x3f800000;
            auVar123._0_8_ = 0x3f8000003f800000;
            auVar123._12_4_ = 0x3f800000;
            auVar123._16_4_ = 0x3f800000;
            auVar123._20_4_ = 0x3f800000;
            auVar123._24_4_ = 0x3f800000;
            auVar123._28_4_ = 0x3f800000;
            auVar55 = vfnmadd213ps_fma(auVar51,auVar68,auVar123);
            auVar55 = vfmadd132ps_fma(ZEXT1632(auVar55),auVar51,auVar51);
            local_11c0 = ZEXT1632(CONCAT412((auVar61._12_4_ + auVar61._12_4_) * auVar55._12_4_,
                                            CONCAT48((auVar61._8_4_ + auVar61._8_4_) * auVar55._8_4_
                                                     ,CONCAT44((auVar61._4_4_ + auVar61._4_4_) *
                                                               auVar55._4_4_,
                                                               (auVar61._0_4_ + auVar61._0_4_) *
                                                               auVar55._0_4_))));
            auVar54 = ZEXT3264(local_11c0);
            uVar48 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar87._4_4_ = uVar48;
            auVar87._0_4_ = uVar48;
            auVar87._8_4_ = uVar48;
            auVar87._12_4_ = uVar48;
            auVar87._16_4_ = uVar48;
            auVar87._20_4_ = uVar48;
            auVar87._24_4_ = uVar48;
            auVar87._28_4_ = uVar48;
            auVar51 = vcmpps_avx(auVar87,local_11c0,2);
            fVar124 = (ray->super_RayK<1>).tfar;
            auVar115._4_4_ = fVar124;
            auVar115._0_4_ = fVar124;
            auVar115._8_4_ = fVar124;
            auVar115._12_4_ = fVar124;
            auVar115._16_4_ = fVar124;
            auVar115._20_4_ = fVar124;
            auVar115._24_4_ = fVar124;
            auVar115._28_4_ = fVar124;
            auVar52 = vcmpps_avx(local_11c0,auVar115,2);
            auVar51 = vandps_avx(auVar52,auVar51);
            auVar116._0_8_ = CONCAT44(fVar69,auVar72._0_4_) ^ 0x8000000080000000;
            auVar116._8_4_ = -fVar70;
            auVar116._12_4_ = -fVar71;
            auVar116._16_4_ = 0x80000000;
            auVar116._20_4_ = 0x80000000;
            auVar116._24_4_ = 0x80000000;
            auVar116._28_4_ = 0x80000000;
            auVar52 = vcmpps_avx(auVar116,auVar68,4);
            auVar51 = vandps_avx(auVar51,auVar52);
            auVar55 = vpackssdw_avx(auVar51._0_16_,auVar51._16_16_);
            auVar90 = vpand_avx(auVar55,auVar90);
            local_1220 = vpmovsxwd_avx2(auVar90);
            if ((((((((local_1220 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_1220 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_1220 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_1220 >> 0x7f,0) != '\0') ||
                  (local_1220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(local_1220 >> 0xbf,0) != '\0') ||
                (local_1220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                local_1220[0x1f] < '\0') {
              uStack_12d0 = 0;
              uStack_12cc = 0;
              uStack_12c8 = 0;
              uStack_12c4 = 0;
              local_12c0 = ZEXT1632(auVar81);
              auVar51 = vrcpps_avx(local_12a0);
              auVar117._8_4_ = 0x3f800000;
              auVar117._0_8_ = 0x3f8000003f800000;
              auVar117._12_4_ = 0x3f800000;
              auVar117._16_4_ = 0x3f800000;
              auVar117._20_4_ = 0x3f800000;
              auVar117._24_4_ = 0x3f800000;
              auVar117._28_4_ = 0x3f800000;
              auVar55 = vfnmadd213ps_fma(local_12a0,auVar51,auVar117);
              auVar55 = vfmadd132ps_fma(ZEXT1632(auVar55),auVar51,auVar51);
              auVar88._8_4_ = 0x219392ef;
              auVar88._0_8_ = 0x219392ef219392ef;
              auVar88._12_4_ = 0x219392ef;
              auVar88._16_4_ = 0x219392ef;
              auVar88._20_4_ = 0x219392ef;
              auVar88._24_4_ = 0x219392ef;
              auVar88._28_4_ = 0x219392ef;
              auVar51 = vcmpps_avx(local_10c0,auVar88,5);
              auVar51 = vandps_avx(auVar51,ZEXT1632(auVar55));
              auVar31._4_4_ = local_12e0._4_4_ * auVar51._4_4_;
              auVar31._0_4_ = local_12e0._0_4_ * auVar51._0_4_;
              auVar31._8_4_ = local_12e0._8_4_ * auVar51._8_4_;
              auVar31._12_4_ = local_12e0._12_4_ * auVar51._12_4_;
              auVar31._16_4_ = auVar51._16_4_ * 0.0;
              auVar31._20_4_ = auVar51._20_4_ * 0.0;
              auVar31._24_4_ = auVar51._24_4_ * 0.0;
              auVar31._28_4_ = 0;
              auVar52 = vminps_avx(auVar31,auVar117);
              auVar79._0_4_ = auVar81._0_4_ * auVar51._0_4_;
              auVar79._4_4_ = auVar81._4_4_ * auVar51._4_4_;
              auVar79._8_4_ = auVar81._8_4_ * auVar51._8_4_;
              auVar79._12_4_ = auVar81._12_4_ * auVar51._12_4_;
              auVar79._16_4_ = auVar51._16_4_ * 0.0;
              auVar79._20_4_ = auVar51._20_4_ * 0.0;
              auVar79._24_4_ = auVar51._24_4_ * 0.0;
              auVar79._28_4_ = 0;
              auVar51 = vminps_avx(auVar79,auVar117);
              auVar68 = vsubps_avx(auVar117,auVar52);
              local_11e0 = vblendvps_avx(auVar51,auVar68,local_1100);
              auVar51 = vsubps_avx(auVar117,auVar51);
              local_1200 = vblendvps_avx(auVar52,auVar51,local_1100);
              local_1140 = local_1100;
              local_11a0[0] = local_1280._0_4_ * (float)local_1120._0_4_;
              local_11a0[1] = local_1280._4_4_ * (float)local_1120._4_4_;
              local_11a0[2] = local_1280._8_4_ * fStack_1118;
              local_11a0[3] = local_1280._12_4_ * fStack_1114;
              fStack_1190 = local_1280._16_4_ * fStack_1110;
              fStack_118c = local_1280._20_4_ * fStack_110c;
              fStack_1188 = local_1280._24_4_ * fStack_1108;
              uStack_1184 = local_1200._28_4_;
              local_1180[0] = (float)local_1120._0_4_ * local_1260._0_4_;
              local_1180[1] = (float)local_1120._4_4_ * local_1260._4_4_;
              local_1180[2] = fStack_1118 * local_1260._8_4_;
              local_1180[3] = fStack_1114 * local_1260._12_4_;
              fStack_1170 = fStack_1110 * local_1260._16_4_;
              fStack_116c = fStack_110c * local_1260._20_4_;
              fStack_1168 = fStack_1108 * local_1260._24_4_;
              uStack_1164 = auVar51._28_4_;
              local_1160[0] = (float)local_1120._0_4_ * fVar89;
              local_1160[1] = (float)local_1120._4_4_ * fVar96;
              local_1160[2] = fStack_1118 * fVar97;
              local_1160[3] = fStack_1114 * fVar98;
              fStack_1150 = fStack_1110 * fVar99;
              fStack_114c = fStack_110c * fVar100;
              fStack_1148 = fStack_1108 * fVar101;
              uStack_1144 = uStack_1104;
              auVar51 = vpmovzxwd_avx2(auVar90);
              auVar51 = vpslld_avx2(auVar51,0x1f);
              auVar80._8_4_ = 0x7f800000;
              auVar80._0_8_ = 0x7f8000007f800000;
              auVar80._12_4_ = 0x7f800000;
              auVar80._16_4_ = 0x7f800000;
              auVar80._20_4_ = 0x7f800000;
              auVar80._24_4_ = 0x7f800000;
              auVar80._28_4_ = 0x7f800000;
              auVar51 = vblendvps_avx(auVar80,local_11c0,auVar51);
              auVar52 = vshufps_avx(auVar51,auVar51,0xb1);
              auVar52 = vminps_avx(auVar51,auVar52);
              auVar68 = vshufpd_avx(auVar52,auVar52,5);
              auVar52 = vminps_avx(auVar52,auVar68);
              auVar68 = vpermpd_avx2(auVar52,0x4e);
              auVar52 = vminps_avx(auVar52,auVar68);
              auVar51 = vcmpps_avx(auVar51,auVar52,0);
              auVar81 = vpackssdw_avx(auVar51._0_16_,auVar51._16_16_);
              auVar81 = vpand_avx(auVar81,auVar90);
              auVar51 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
              auVar105 = ZEXT3264(auVar51);
              local_1420 = local_1220;
              auVar52 = vpmovzxwd_avx2(auVar81);
              auVar52 = vpslld_avx2(auVar52,0x1f);
              if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar52 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar52 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar52 >> 0x7f,0) == '\0') &&
                    (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar52 >> 0xbf,0) == '\0') &&
                  (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar52[0x1f]) {
                auVar52 = local_1220;
              }
              uVar33 = vextractps_avx(auVar51._0_16_,1);
              uVar35 = vmovmskps_avx(auVar52);
              uVar36 = 0;
              for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x80000000) {
                uVar36 = uVar36 + 1;
              }
              local_1500._0_8_ = context->scene;
              pSVar39 = context->scene;
              do {
                uVar45 = CONCAT44(0,uVar36);
                local_1438 = *(uint *)((long)&local_fc0 + uVar45 * 4);
                pGVar3 = (pSVar39->geometries).items[local_1438].ptr;
                if ((pGVar3->mask & uVar33) == 0) {
                  *(undefined4 *)(local_1420 + uVar45 * 4) = 0;
                }
                else {
                  local_14e0._0_8_ = uVar45;
                  local_1480 = (byte *)context->args;
                  local_13e0 = auVar105._0_32_;
                  if (context->args->filter == (RTCFilterFunctionN)0x0) {
                    local_14b0.context = context->user;
                    if (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                      fVar124 = *(float *)(local_1200 + uVar45 * 4);
                      fVar125 = *(float *)(local_11e0 + uVar45 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_11c0 + uVar45 * 4);
                      (ray->Ng).field_0.field_0.x = local_11a0[uVar45];
                      (ray->Ng).field_0.field_0.y = local_1180[uVar45];
                      (ray->Ng).field_0.field_0.z = local_1160[uVar45];
                      ray->u = fVar124;
                      ray->v = fVar125;
                      ray->primID = *(uint *)((long)&local_1300 + uVar45 * 4);
                      ray->geomID = local_1438;
                      ray->instID[0] = (local_14b0.context)->instID[0];
                      ray->instPrimID[0] = (local_14b0.context)->instPrimID[0];
                      break;
                    }
                  }
                  else {
                    local_14b0.context = context->user;
                  }
                  local_1450 = local_11a0[uVar45];
                  local_144c = local_1180[uVar45];
                  local_1448 = local_1160[uVar45];
                  local_1444 = *(undefined4 *)(local_1200 + uVar45 * 4);
                  local_1440 = *(undefined4 *)(local_11e0 + uVar45 * 4);
                  local_143c = *(undefined4 *)((long)&local_1300 + uVar45 * 4);
                  local_1434 = (local_14b0.context)->instID[0];
                  local_1430 = (local_14b0.context)->instPrimID[0];
                  (ray->super_RayK<1>).tfar = *(float *)(local_11c0 + uVar45 * 4);
                  local_1544 = -1;
                  local_14b0.valid = &local_1544;
                  local_14b0.geometryUserPtr = pGVar3->userPtr;
                  local_14b0.ray = (RTCRayN *)ray;
                  local_14b0.hit = (RTCHitN *)&local_1450;
                  local_14b0.N = 1;
                  local_1520._0_8_ = pGVar3;
                  local_13c0 = auVar54._0_32_;
                  if (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0148f604:
                    if ((*(code **)(local_1480 + 0x10) != (code *)0x0) &&
                       (((*local_1480 & 2) != 0 ||
                        ((*(byte *)(local_1520._0_8_ + 0x3e) & 0x40) != 0)))) {
                      (**(code **)(local_1480 + 0x10))(&local_14b0);
                      auVar54 = ZEXT3264(local_13c0);
                      context = local_1528;
                      ray = local_1530;
                      uVar41 = local_1538;
                      uVar42 = local_1540;
                      if (*local_14b0.valid == 0) goto LAB_0148f6c4;
                    }
                    (((Vec3f *)((long)local_14b0.ray + 0x30))->field_0).field_0.x =
                         *(float *)local_14b0.hit;
                    (((Vec3f *)((long)local_14b0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_14b0.hit + 4);
                    (((Vec3f *)((long)local_14b0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_14b0.hit + 8);
                    *(float *)((long)local_14b0.ray + 0x3c) = *(float *)(local_14b0.hit + 0xc);
                    *(float *)((long)local_14b0.ray + 0x40) = *(float *)(local_14b0.hit + 0x10);
                    *(float *)((long)local_14b0.ray + 0x44) = *(float *)(local_14b0.hit + 0x14);
                    *(float *)((long)local_14b0.ray + 0x48) = *(float *)(local_14b0.hit + 0x18);
                    *(float *)((long)local_14b0.ray + 0x4c) = *(float *)(local_14b0.hit + 0x1c);
                    *(float *)((long)local_14b0.ray + 0x50) = *(float *)(local_14b0.hit + 0x20);
                  }
                  else {
                    (*pGVar3->intersectionFilterN)(&local_14b0);
                    auVar54 = ZEXT3264(local_13c0);
                    context = local_1528;
                    ray = local_1530;
                    uVar41 = local_1538;
                    uVar42 = local_1540;
                    if (*local_14b0.valid != 0) goto LAB_0148f604;
LAB_0148f6c4:
                    (local_1530->super_RayK<1>).tfar = (float)local_13e0._0_4_;
                    context = local_1528;
                    ray = local_1530;
                    uVar41 = local_1538;
                    uVar42 = local_1540;
                  }
                  *(undefined4 *)(local_1420 + local_14e0._0_8_ * 4) = 0;
                  fVar124 = (ray->super_RayK<1>).tfar;
                  auVar53._4_4_ = fVar124;
                  auVar53._0_4_ = fVar124;
                  auVar53._8_4_ = fVar124;
                  auVar53._12_4_ = fVar124;
                  auVar53._16_4_ = fVar124;
                  auVar53._20_4_ = fVar124;
                  auVar53._24_4_ = fVar124;
                  auVar53._28_4_ = fVar124;
                  auVar51 = vcmpps_avx(auVar54._0_32_,auVar53,2);
                  local_1420 = vandps_avx(auVar51,local_1420);
                  uVar33 = (ray->super_RayK<1>).mask;
                  auVar105 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
                }
                if ((((((((local_1420 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_1420 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_1420 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_1420 >> 0x7f,0) == '\0') &&
                      (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_1420 >> 0xbf,0) == '\0') &&
                    (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_1420[0x1f]) break;
                auVar60._8_4_ = 0x7f800000;
                auVar60._0_8_ = 0x7f8000007f800000;
                auVar60._12_4_ = 0x7f800000;
                auVar60._16_4_ = 0x7f800000;
                auVar60._20_4_ = 0x7f800000;
                auVar60._24_4_ = 0x7f800000;
                auVar60._28_4_ = 0x7f800000;
                auVar51 = vblendvps_avx(auVar60,auVar54._0_32_,local_1420);
                auVar52 = vshufps_avx(auVar51,auVar51,0xb1);
                auVar52 = vminps_avx(auVar51,auVar52);
                auVar68 = vshufpd_avx(auVar52,auVar52,5);
                auVar52 = vminps_avx(auVar52,auVar68);
                auVar68 = vpermpd_avx2(auVar52,0x4e);
                auVar52 = vminps_avx(auVar52,auVar68);
                auVar52 = vcmpps_avx(auVar51,auVar52,0);
                auVar68 = local_1420 & auVar52;
                auVar51 = local_1420;
                if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar68 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar68 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar68 >> 0x7f,0) != '\0') ||
                      (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar68 >> 0xbf,0) != '\0') ||
                    (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar68[0x1f] < '\0') {
                  auVar51 = vandps_avx(auVar52,local_1420);
                }
                uVar35 = vmovmskps_avx(auVar51);
                uVar36 = 0;
                for (; pSVar39 = (Scene *)local_1500._0_8_, (uVar35 & 1) == 0;
                    uVar35 = uVar35 >> 1 | 0x80000000) {
                  uVar36 = uVar36 + 1;
                }
              } while( true );
            }
          }
          auVar112 = ZEXT1664(local_1310);
          auVar118 = ZEXT1664(local_1320);
          auVar121 = ZEXT1664(local_1330);
          auVar127 = ZEXT1664(local_1350);
          auVar128 = ZEXT1664(local_1360);
          auVar134 = ZEXT1664(local_1380);
          auVar136 = ZEXT1664(local_1390);
          auVar105 = ZEXT1664(local_13f0);
          auVar82._0_4_ = local_1340;
          fVar124 = fStack_133c;
          fVar125 = fStack_1338;
          fVar126 = fStack_1334;
          auVar72._0_4_ = local_1370;
          fVar130 = fStack_136c;
          fVar131 = fStack_1368;
          fVar132 = fStack_1364;
        }
        fVar69 = (ray->super_RayK<1>).tfar;
        auVar54 = ZEXT1664(CONCAT412(fVar69,CONCAT48(fVar69,CONCAT44(fVar69,fVar69))));
      }
      goto LAB_0148eb70;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }